

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status
filemgr_write_offset
          (filemgr *file,bid_t bid,uint64_t offset,uint64_t len,void *buf,bool final_write,
          err_log_callback *log_callback)

{
  plock *plock;
  bool bVar1;
  fdb_status io_error;
  uint32_t uVar2;
  int iVar3;
  fdb_status fVar4;
  plock_entry_t *plock_entry;
  uint64_t uVar5;
  void *buf_00;
  ulong uVar6;
  undefined7 in_register_00000089;
  size_t line_number;
  char *pcVar7;
  char *format;
  char *pcVar8;
  bid_t bid_local;
  bid_t is_writer;
  
  pcVar8 = (char *)(file->last_commit).super___atomic_base<unsigned_long>._M_i;
  bid_local = bid;
  if ((ulong)file->blocksize < len + offset) {
    fdb_log_impl(log_callback,2,FDB_RESULT_WRITE_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_write_offset",0x8bc,
                 "Write error: trying to write the buffer data (offset: %lu, len: %lu that exceeds the block size %lu in a database file \'%s\'\n"
                 ,offset,len,(ulong)file->blocksize,file->filename);
    return FDB_RESULT_WRITE_FAIL;
  }
  fVar4 = (fdb_status)CONCAT71(in_register_00000089,final_write);
  pcVar7 = (char *)(file->blocksize * bid + offset);
  if ((file->sb == (superblock *)0x0) ||
     ((file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i == 0)) {
    if ((pcVar7 < pcVar8) &&
       ((file->sb == (superblock *)0x0 ||
        ((char *)(ulong)((uint)file->sb->config->num_sb * file->blocksize) <= pcVar7)))) {
      line_number = 0x8d3;
      format = 
      "Write error: trying to write at the offset %lu that is smaller than the current commit offset %lu in a database file \'%s\'\n"
      ;
      goto LAB_0012dbb9;
    }
  }
  else {
    bVar1 = (*sb_ops.is_writable)(file,bid);
    if (!bVar1) {
      line_number = 0x8c7;
      pcVar8 = file->filename;
      format = 
      "Write error: trying to write at the offset %lu that is not identified as a reusable block in a database file \'%s\'\n"
      ;
LAB_0012dbb9:
      fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_write_offset",line_number,format,pcVar7,pcVar8);
      return FDB_RESULT_WRITE_FAIL;
    }
  }
  if (global_config.ncacheblock < 1) {
    if ((file->blocksize == len) && (*(char *)((long)buf + ((ulong)file->blocksize - 1)) == -1)) {
      *(undefined8 *)((long)buf + 8) = 0xffffffffffffffff;
      uVar2 = get_checksum((uint8_t *)buf,(ulong)file->blocksize,file->crc_mode);
      *(uint32_t *)((long)buf + 8) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    uVar5 = (*file->ops->pwrite)(file->fd,buf,len,(cs_off_t)pcVar7);
    _log_errno_str(file->ops,log_callback,(fdb_status)uVar5,"WRITE",file->filename);
    if (uVar5 == len) {
      return FDB_RESULT_SUCCESS;
    }
    if ((long)uVar5 < 0) {
      return (fdb_status)uVar5;
    }
    return FDB_RESULT_WRITE_FAIL;
  }
  is_writer = 1;
  plock = &file->plock;
  plock_entry = plock_lock(plock,&bid_local,&is_writer);
  if (file->blocksize == len) {
    io_error = bcache_write(file,bid_local,buf,BCACHE_REQ_DIRTY,final_write,false);
    if (io_error != global_config.blocksize) {
      plock_unlock(plock,plock_entry);
      _log_errno_str(file->ops,log_callback,io_error,"WRITE",file->filename);
      fVar4 = FDB_RESULT_WRITE_FAIL;
      if (io_error < FDB_RESULT_SUCCESS) {
        fVar4 = io_error;
      }
LAB_0012dd3b:
      bVar1 = false;
      goto LAB_0012dd3d;
    }
  }
  else {
    iVar3 = bcache_write_partial(file,bid_local,buf,offset,len,final_write);
    if (iVar3 != 0) goto LAB_0012dd28;
    buf_00 = (void *)(*file->ops->goto_eof)(file->fd);
    if ((long)buf_00 < 0) {
      _log_errno_str(file->ops,log_callback,(fdb_status)buf_00,"EOF",file->filename);
LAB_0012dd22:
      bVar1 = false;
    }
    else {
      uVar6 = (ulong)buf_00 / (ulong)file->blocksize;
      buf_00 = _filemgr_get_temp_buf();
      if ((bid_local < uVar6) &&
         (uVar6 = filemgr_read_block(file,buf_00,bid_local), uVar6 != file->blocksize)) {
        plock_unlock(plock,plock_entry);
        _filemgr_release_temp_buf(buf_00);
        _log_errno_str(file->ops,log_callback,(fdb_status)uVar6,"READ",file->filename);
        buf_00 = (void *)0xfffffffb;
        if ((long)uVar6 < 0) {
          buf_00 = (void *)(uVar6 & 0xffffffff);
        }
        goto LAB_0012dd22;
      }
      memcpy((void *)((long)buf_00 + offset),buf,len);
      fVar4 = bcache_write(file,bid_local,buf_00,BCACHE_REQ_DIRTY,final_write,false);
      if (fVar4 != global_config.blocksize) {
        plock_unlock(plock,plock_entry);
        _filemgr_release_temp_buf(buf_00);
        _log_errno_str(file->ops,log_callback,fVar4,"WRITE",file->filename);
        buf_00 = (void *)0xfffffffc;
        if (fVar4 < FDB_RESULT_SUCCESS) {
          buf_00 = (void *)(ulong)(uint)fVar4;
        }
        goto LAB_0012dd22;
      }
      _filemgr_release_temp_buf(buf_00);
      bVar1 = true;
    }
    fVar4 = (fdb_status)buf_00;
    if (!bVar1) goto LAB_0012dd3b;
  }
LAB_0012dd28:
  plock_unlock(plock,plock_entry);
  bVar1 = true;
LAB_0012dd3d:
  if (bVar1) {
    return FDB_RESULT_SUCCESS;
  }
  return fVar4;
}

Assistant:

fdb_status filemgr_write_offset(struct filemgr *file, bid_t bid,
                                uint64_t offset, uint64_t len, void *buf,
                                bool final_write,
                                err_log_callback *log_callback)
{
    size_t lock_no;
    ssize_t r = 0;
    uint64_t pos = bid * file->blocksize + offset;
    uint64_t curr_commit_pos = atomic_get_uint64_t(&file->last_commit);

    if (offset + len > file->blocksize) {
        const char *msg = "Write error: trying to write the buffer data "
            "(offset: %" _F64 ", len: %" _F64 " that exceeds the block size "
            "%" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_WRITE_FAIL,
                msg, offset, len,
                file->blocksize, file->filename);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (sb_bmp_exists(file->sb)) {
        // block reusing is enabled
        if (!sb_ops.is_writable(file, bid)) {
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "not identified as a reusable block in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    } else if (pos < curr_commit_pos) {
        // stale blocks are not reused yet
        if (file->sb == NULL ||
            (file->sb && pos >= file->sb->config->num_sb * file->blocksize)) {
            // (non-sequential update is exceptionally allowed for superblocks)
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "smaller than the current commit offset %" _F64 " in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, curr_commit_pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        bool locked = false;
        plock_entry_t *plock_entry;
        bid_t is_writer = 1;
        plock_entry = plock_lock(&file->plock, &bid, &is_writer);
        locked = true;

        if (len == file->blocksize) {
            // write entire block .. we don't need to read previous block
            r = bcache_write(file, bid, buf, BCACHE_REQ_DIRTY, final_write, false);
            if (r != global_config.blocksize) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                _log_errno_str(file->ops, log_callback,
                               (fdb_status) r, "WRITE", file->filename);
                return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
            }
        } else {
            // partially write buffer cache first
            r = bcache_write_partial(file, bid, buf, offset, len, final_write);
            if (r == 0) {
                // cache miss
                // write partially .. we have to read previous contents of the block
                int64_t cur_file_pos = file->ops->goto_eof(file->fd);
                if (cur_file_pos < 0) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) cur_file_pos, "EOF", file->filename);
                    return (fdb_status) cur_file_pos;
                }
                bid_t cur_file_last_bid = cur_file_pos / file->blocksize;
                void *_buf = _filemgr_get_temp_buf();

                if (bid >= cur_file_last_bid) {
                    // this is the first time to write this block
                    // we don't need to read previous block from file.
                } else {
                    r = filemgr_read_block(file, _buf, bid);
                    if (r != (ssize_t)file->blocksize) {
                        if (locked) {
                            plock_unlock(&file->plock, plock_entry);
                        }
                        _filemgr_release_temp_buf(_buf);
                        _log_errno_str(file->ops, log_callback, (fdb_status) r,
                                       "READ", file->filename);
                        return r < 0 ? (fdb_status) r : FDB_RESULT_READ_FAIL;
                    }
                }
                memcpy((uint8_t *)_buf + offset, buf, len);
                r = bcache_write(file, bid, _buf, BCACHE_REQ_DIRTY, final_write, false);
                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _filemgr_release_temp_buf(_buf);
                    _log_errno_str(file->ops, log_callback,
                            (fdb_status) r, "WRITE", file->filename);
                    return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                }

                _filemgr_release_temp_buf(_buf);
            } // cache miss
        } // full block or partial block

        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else { // block cache disabled

        if (len == file->blocksize) {
            uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
            if (marker == BLK_MARKER_BNODE) {
                memset((uint8_t *)buf + BTREE_CRC_OFFSET, 0xff, BTREE_CRC_FIELD_LEN);
                uint32_t crc32 = get_checksum(reinterpret_cast<const uint8_t*>(buf),
                                              file->blocksize,
                                              file->crc_mode);
                crc32 = _endian_encode(crc32);
                memcpy((uint8_t *)buf + BTREE_CRC_OFFSET, &crc32, sizeof(crc32));
            }
        }

        r = file->ops->pwrite(file->fd, buf, len, pos);
        _log_errno_str(file->ops, log_callback, (fdb_status) r, "WRITE", file->filename);
        if ((uint64_t)r != len) {
            return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
        }
    } // block cache check
    return FDB_RESULT_SUCCESS;
}